

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_>::
disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_>
            *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>::~ImmediatePromiseNode
              ((ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *)pointer);
    operator_delete(pointer,0x180);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }